

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# re2.cc
# Opt level: O2

void __thiscall re2::RE2::RE2(RE2 *this,char *pattern)

{
  StringPiece SStack_48;
  Options local_38;
  
  Options::Options(&this->options_);
  (this->prefix_)._M_dataplus._M_p = (pointer)&(this->prefix_).field_2;
  (this->prefix_)._M_string_length = 0;
  (this->prefix_).field_2._M_local_buf[0] = '\0';
  this->rprog_once_ = 0;
  this->named_groups_once_ = 0;
  (this->group_names_once_)._M_once = 0;
  StringPiece::StringPiece(&SStack_48,pattern);
  local_38.max_mem_ = 0x800000;
  local_38.encoding_ = EncodingUTF8;
  local_38.posix_syntax_ = false;
  local_38.longest_match_ = false;
  local_38.log_errors_ = true;
  local_38.literal_ = false;
  local_38.never_nl_ = false;
  local_38.dot_nl_ = false;
  local_38.never_capture_ = false;
  local_38.case_sensitive_ = true;
  local_38.perl_classes_ = false;
  local_38.word_boundary_ = false;
  local_38.one_line_ = false;
  Init(this,&SStack_48,&local_38);
  return;
}

Assistant:

RE2::RE2(const char* pattern) {
  Init(pattern, DefaultOptions);
}